

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O3

int ON__ClassIdDumpNode_CompareUuid(ON__ClassIdDumpNode *a,ON__ClassIdDumpNode *b)

{
  int iVar1;
  
  if (a == (ON__ClassIdDumpNode *)0x0) {
    return -(uint)(b != (ON__ClassIdDumpNode *)0x0);
  }
  if (b == (ON__ClassIdDumpNode *)0x0) {
    return 1;
  }
  iVar1 = ON__ClassIdDumpNode::CompareClassUuid(a,b);
  return iVar1;
}

Assistant:

static int ON__ClassIdDumpNode_CompareUuid( const ON__ClassIdDumpNode* a, const ON__ClassIdDumpNode* b )
{
  int rc = 0;
  if ( 0 == a )
  {
    rc = (0 == b) ? 0 : -1;
  }
  else if ( 0 == b )
  {
    rc = 1;
  }
  else
  {
    rc = a->CompareClassUuid(*b);
  }
  return rc;
}